

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

void duckdb::FilterSelectionSwitch<unsigned_int>
               (UnifiedVectorFormat *vdata,uint predicate,SelectionVector *sel,
               idx_t *approved_tuple_count,ExpressionType comparison_type)

{
  uint uVar1;
  unsigned_long *puVar2;
  idx_t iVar3;
  sel_t *psVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  idx_t iVar7;
  NotImplementedException *this;
  undefined7 in_register_00000081;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  ulong uVar11;
  SelectionVector new_sel;
  SelectionVector local_60;
  string local_48;
  
  SelectionVector::SelectionVector(&local_60,*approved_tuple_count);
  switch((int)CONCAT71(in_register_00000081,comparison_type)) {
  case 0x19:
    puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar3 = *approved_tuple_count;
    if (puVar2 == (unsigned_long *)0x0) {
      if (iVar3 != 0) {
        pdVar5 = vdata->data;
        psVar4 = sel->sel_vector;
        psVar6 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar4 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar4[iVar8];
          }
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          uVar1 = *(uint *)(pdVar5 + iVar10 * 4);
          local_60.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (uVar1 == predicate);
          iVar8 = iVar8 + 1;
        } while (iVar3 != iVar8);
        goto LAB_00605335;
      }
    }
    else if (iVar3 != 0) {
      psVar4 = sel->sel_vector;
      pdVar5 = vdata->data;
      psVar6 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar8];
        }
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        if ((puVar2[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(*(uint *)(pdVar5 + iVar10 * 4) == predicate);
        }
        local_60.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar3 != iVar8);
      goto LAB_00605335;
    }
    break;
  case 0x1a:
    puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar3 = *approved_tuple_count;
    if (puVar2 == (unsigned_long *)0x0) {
      if (iVar3 != 0) {
        pdVar5 = vdata->data;
        psVar4 = sel->sel_vector;
        psVar6 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar4 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar4[iVar8];
          }
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          uVar1 = *(uint *)(pdVar5 + iVar10 * 4);
          local_60.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (uVar1 != predicate);
          iVar8 = iVar8 + 1;
        } while (iVar3 != iVar8);
        goto LAB_00605335;
      }
    }
    else if (iVar3 != 0) {
      psVar4 = sel->sel_vector;
      pdVar5 = vdata->data;
      psVar6 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar8];
        }
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        if ((puVar2[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(*(uint *)(pdVar5 + iVar10 * 4) != predicate);
        }
        local_60.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar3 != iVar8);
      goto LAB_00605335;
    }
    break;
  case 0x1b:
    puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar3 = *approved_tuple_count;
    if (puVar2 == (unsigned_long *)0x0) {
      if (iVar3 != 0) {
        pdVar5 = vdata->data;
        psVar4 = sel->sel_vector;
        psVar6 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar4 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar4[iVar8];
          }
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          uVar1 = *(uint *)(pdVar5 + iVar10 * 4);
          local_60.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (uVar1 < predicate);
          iVar8 = iVar8 + 1;
        } while (iVar3 != iVar8);
        goto LAB_00605335;
      }
    }
    else if (iVar3 != 0) {
      psVar4 = sel->sel_vector;
      pdVar5 = vdata->data;
      psVar6 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar8];
        }
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        if ((puVar2[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(*(uint *)(pdVar5 + iVar10 * 4) < predicate);
        }
        local_60.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar3 != iVar8);
      goto LAB_00605335;
    }
    break;
  case 0x1c:
    puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar3 = *approved_tuple_count;
    if (puVar2 == (unsigned_long *)0x0) {
      if (iVar3 != 0) {
        pdVar5 = vdata->data;
        psVar4 = sel->sel_vector;
        psVar6 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar4 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar4[iVar8];
          }
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          uVar1 = *(uint *)(pdVar5 + iVar10 * 4);
          local_60.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (predicate < uVar1);
          iVar8 = iVar8 + 1;
        } while (iVar3 != iVar8);
        goto LAB_00605335;
      }
    }
    else if (iVar3 != 0) {
      psVar4 = sel->sel_vector;
      pdVar5 = vdata->data;
      psVar6 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar8];
        }
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        if ((puVar2[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(predicate < *(uint *)(pdVar5 + iVar10 * 4));
        }
        local_60.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar3 != iVar8);
      goto LAB_00605335;
    }
    break;
  case 0x1d:
    puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar3 = *approved_tuple_count;
    if (puVar2 == (unsigned_long *)0x0) {
      if (iVar3 != 0) {
        pdVar5 = vdata->data;
        psVar4 = sel->sel_vector;
        psVar6 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar4 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar4[iVar8];
          }
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          uVar1 = *(uint *)(pdVar5 + iVar10 * 4);
          local_60.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = (iVar7 + 1) - (ulong)(predicate < uVar1);
          iVar8 = iVar8 + 1;
        } while (iVar3 != iVar8);
        goto LAB_00605335;
      }
    }
    else if (iVar3 != 0) {
      psVar4 = sel->sel_vector;
      pdVar5 = vdata->data;
      psVar6 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar8];
        }
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        if ((puVar2[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(*(uint *)(pdVar5 + iVar10 * 4) <= predicate);
        }
        local_60.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar3 != iVar8);
      goto LAB_00605335;
    }
    break;
  case 0x1e:
    puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar3 = *approved_tuple_count;
    if (puVar2 == (unsigned_long *)0x0) {
      if (iVar3 != 0) {
        pdVar5 = vdata->data;
        psVar4 = sel->sel_vector;
        psVar6 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar4 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar4[iVar8];
          }
          iVar10 = iVar9;
          if (psVar6 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar6[iVar9];
          }
          uVar1 = *(uint *)(pdVar5 + iVar10 * 4);
          local_60.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = (iVar7 + 1) - (ulong)(uVar1 < predicate);
          iVar8 = iVar8 + 1;
        } while (iVar3 != iVar8);
        goto LAB_00605335;
      }
    }
    else if (iVar3 != 0) {
      psVar4 = sel->sel_vector;
      pdVar5 = vdata->data;
      psVar6 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar8];
        }
        iVar10 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar6[iVar9];
        }
        if ((puVar2[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(predicate <= *(uint *)(pdVar5 + iVar10 * 4));
        }
        local_60.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar3 != iVar8);
      goto LAB_00605335;
    }
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unknown comparison type for filter pushed down to table!","");
    NotImplementedException::NotImplementedException(this,&local_48);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar7 = 0;
LAB_00605335:
  *approved_tuple_count = iVar7;
  shared_ptr<duckdb::SelectionData,_true>::operator=(&sel->selection_data,&local_60.selection_data);
  sel->sel_vector = local_60.sel_vector;
  if (local_60.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void FilterSelectionSwitch(UnifiedVectorFormat &vdata, T predicate, SelectionVector &sel,
                                  idx_t &approved_tuple_count, ExpressionType comparison_type) {
	SelectionVector new_sel(approved_tuple_count);
	auto &mask = vdata.validity;
	// the inplace loops take the result as the last parameter
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_NOTEQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, LessThanEquals, false>(vdata, predicate, sel,
			                                                                          approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThanEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, false>(vdata, predicate, sel,
			                                                                             approved_tuple_count, new_sel);
		} else {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, true>(vdata, predicate, sel,
			                                                                            approved_tuple_count, new_sel);
		}
		break;
	}
	default:
		throw NotImplementedException("Unknown comparison type for filter pushed down to table!");
	}
	sel.Initialize(new_sel);
}